

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O1

Result_t *
Kumu::ReadFileIntoString
          (Result_t *__return_storage_ptr__,string *filename,string *outString,ui32_t max_size)

{
  fsize_t fVar1;
  ILogSink *this;
  undefined1 *__return_storage_ptr___00;
  ui32_t read_size;
  ByteString ReadBuf;
  FileReader File;
  Result_t result;
  ui32_t local_144;
  ByteString local_140;
  FileReader local_128;
  Result_t local_f8;
  Result_t local_90;
  
  local_144 = 0;
  FileReader::FileReader(&local_128);
  ByteString::ByteString(&local_140);
  __return_storage_ptr___00 = (undefined1 *)&local_90;
  FileReader::OpenRead((Result_t *)__return_storage_ptr___00,&local_128,filename);
  if (-1 < local_90.value) {
    fVar1 = FileReader::Size(&local_128);
    if ((long)(ulong)max_size < fVar1) {
      this = DefaultLogSink();
      ILogSink::Error(this,"%s: exceeds available buffer size (%u)\n",(filename->_M_dataplus)._M_p,
                      (ulong)max_size);
      __return_storage_ptr___00 = RESULT_ALLOC;
      goto LAB_00114df7;
    }
    if (fVar1 == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)outString,0,(char *)outString->_M_string_length,0x11df9b);
      __return_storage_ptr___00 = RESULT_OK;
      goto LAB_00114df7;
    }
    ByteString::Capacity(&local_f8,&local_140,(ui32_t)fVar1);
    Result_t::operator=(&local_90,&local_f8);
    Result_t::~Result_t(&local_f8);
  }
  if (-1 < local_90.value) {
    if (local_140.m_Data == (byte_t *)0x0) {
      __assert_fail("m_Data",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.h"
                    ,0x224,"byte_t *Kumu::ByteString::Data()");
    }
    FileReader::Read(&local_f8,&local_128,local_140.m_Data,local_140.m_Capacity,&local_144);
    Result_t::operator=(&local_90,&local_f8);
    Result_t::~Result_t(&local_f8);
  }
  if (-1 < local_90.value) {
    if (local_140.m_Data == (byte_t *)0x0) {
      __assert_fail("m_Data",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.h"
                    ,0x221,"const byte_t *Kumu::ByteString::RoData() const");
    }
    std::__cxx11::string::_M_replace
              ((ulong)outString,0,(char *)outString->_M_string_length,(ulong)local_140.m_Data);
  }
LAB_00114df7:
  Result_t::Result_t(__return_storage_ptr__,(Result_t *)__return_storage_ptr___00);
  Result_t::~Result_t(&local_90);
  ByteString::~ByteString(&local_140);
  FileReader::~FileReader(&local_128);
  return __return_storage_ptr__;
}

Assistant:

Kumu::Result_t
Kumu::ReadFileIntoString(const std::string& filename, std::string& outString, ui32_t max_size)
{
  fsize_t    fsize = 0;
  ui32_t     read_size = 0;
  FileReader File;
  ByteString ReadBuf;

  Result_t result = File.OpenRead(filename);

  if ( KM_SUCCESS(result) )
    {
      fsize = File.Size();

      if ( fsize > (Kumu::fpos_t)max_size )
	{
	  DefaultLogSink().Error("%s: exceeds available buffer size (%u)\n", filename.c_str(), max_size);
	  return RESULT_ALLOC;
	}

      if ( fsize == 0 )
	{
	  outString = "";
	  return RESULT_OK;
	}

      result = ReadBuf.Capacity((ui32_t)fsize);
    }

  if ( KM_SUCCESS(result) )
    result = File.Read(ReadBuf.Data(), ReadBuf.Capacity(), &read_size);

  if ( KM_SUCCESS(result) )
    outString.assign((const char*)ReadBuf.RoData(), read_size);

  return result;
}